

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

void test_for_append(bsdtar *bsdtar)

{
  int iVar1;
  long *in_RDI;
  stat s;
  stat sStack_98;
  long *local_8;
  
  if ((*(long *)in_RDI[0x12] == 0) && (in_RDI[2] == 0)) {
    lafe_errc(1,0,"no files or directories specified");
  }
  if (*in_RDI == 0) {
    lafe_errc(1,0,"Cannot append to stdout.");
  }
  local_8 = in_RDI;
  iVar1 = stat((char *)*in_RDI,&sStack_98);
  if (((iVar1 == 0) && ((sStack_98.st_mode & 0xf000) != 0x8000)) &&
     ((sStack_98.st_mode & 0xf000) != 0x6000)) {
    lafe_errc(1,0,"Cannot append to %s: not a regular file.",*local_8);
  }
  return;
}

Assistant:

static void
test_for_append(struct bsdtar *bsdtar)
{
	struct stat s;

	if (*bsdtar->argv == NULL && bsdtar->names_from_file == NULL)
		lafe_errc(1, 0, "no files or directories specified");
	if (bsdtar->filename == NULL)
		lafe_errc(1, 0, "Cannot append to stdout.");

	if (stat(bsdtar->filename, &s) != 0)
		return;

	if (!S_ISREG(s.st_mode) && !S_ISBLK(s.st_mode))
		lafe_errc(1, 0,
		    "Cannot append to %s: not a regular file.",
		    bsdtar->filename);

/* Is this an appropriate check here on Windows? */
/*
	if (GetFileType(handle) != FILE_TYPE_DISK)
		lafe_errc(1, 0, "Cannot append");
*/

}